

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_ptr.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,100);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,200);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    int arr[10] = {100, 200, 300};

    int (*p)[10] = &arr;

    std::cout << arr[0] << std::endl;
    std::cout << (*p)[1] << std::endl;

    // int (*p1)[20] = &arr;

    return 0;
}